

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (int tag_size,uint32 tag,CodedInputStream *input,RepeatedField<int> *value)

{
  CodedInputStream *this;
  int iVar1;
  int iVar2;
  char local_8d;
  RepeatedField<int> *value_local;
  CodedInputStream *input_local;
  uint32 tag_local;
  int tag_size_local;
  int elements_already_reserved;
  int value_1;
  CodedInputStream *local_60;
  uint32 local_58;
  int local_54;
  uint local_4c;
  CodedInputStream *local_48;
  char local_3d;
  uint32 local_3c;
  uint32 *puStack_38;
  uint32 temp_1;
  CodedInputStream *local_30;
  undefined1 local_25;
  uint32 local_24;
  uint32 *puStack_20;
  uint32 temp;
  CodedInputStream *local_18;
  undefined1 local_9;
  
  puStack_20 = (uint32 *)&tag_size_local;
  _elements_already_reserved = value;
  local_60 = input;
  local_58 = tag;
  local_54 = tag_size;
  local_18 = input;
  local_9 = io::CodedInputStream::ReadVarint32(input,&local_24);
  if ((bool)local_9) {
    *puStack_20 = local_24;
    RepeatedField<int>::Add(_elements_already_reserved,&tag_size_local);
    iVar1 = RepeatedField<int>::Capacity(_elements_already_reserved);
    iVar2 = RepeatedField<int>::size(_elements_already_reserved);
    tag_local = iVar1 - iVar2;
    while( true ) {
      this = local_60;
      local_8d = '\0';
      if (0 < (int)tag_local) {
        local_48 = local_60;
        local_4c = local_58;
        if (local_58 < 0x80) {
          if ((local_60->buffer_ < local_60->buffer_end_) && (*local_60->buffer_ == local_58)) {
            io::CodedInputStream::Advance(local_60,1);
            local_3d = '\x01';
          }
          else {
            local_3d = '\0';
          }
        }
        else if (local_58 < 0x4000) {
          iVar1 = io::CodedInputStream::BufferSize(local_60);
          if (((iVar1 < 2) || ((uint)*this->buffer_ != (local_4c & 0xff | 0x80))) ||
             ((uint)this->buffer_[1] != (local_4c >> 7 & 0xff))) {
            local_3d = '\0';
          }
          else {
            io::CodedInputStream::Advance(this,2);
            local_3d = '\x01';
          }
        }
        else {
          local_3d = '\0';
        }
        local_8d = local_3d;
      }
      if (local_8d == '\0') {
        return true;
      }
      local_30 = local_60;
      puStack_38 = (uint32 *)&tag_size_local;
      local_25 = io::CodedInputStream::ReadVarint32(local_60,&local_3c);
      if (!(bool)local_25) break;
      *puStack_38 = local_3c;
      RepeatedField<int>::AddAlreadyReserved(_elements_already_reserved,&tag_size_local);
      tag_local = tag_local - 1;
    }
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadRepeatedPrimitiveNoInline(
    int tag_size,
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* value) {
  return ReadRepeatedPrimitive<CType, DeclaredType>(
      tag_size, tag, input, value);
}